

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O3

void G_xor(uint8_t *out,uint8_t *X,uint8_t *Y)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint i;
  long lVar9;
  uint64_t R [128];
  uint64_t Z [128];
  uint64_t Q [128];
  undefined8 local_c18;
  uint auStack_c10 [254];
  ulong local_818 [128];
  uint64_t local_418 [129];
  
  lVar9 = 0;
  do {
    puVar1 = (uint *)(X + lVar9 * 8);
    uVar3 = puVar1[1];
    uVar4 = puVar1[2];
    uVar5 = puVar1[3];
    puVar2 = (uint *)(Y + lVar9 * 8);
    uVar6 = puVar2[1];
    uVar7 = puVar2[2];
    uVar8 = puVar2[3];
    *(uint *)(&local_c18 + lVar9) = *puVar2 ^ *puVar1;
    *(uint *)((long)&local_c18 + lVar9 * 8 + 4) = uVar6 ^ uVar3;
    *(uint *)(local_818 + lVar9 + -0x7f) = uVar7 ^ uVar4;
    *(uint *)((long)local_818 + lVar9 * 8 + -0x3f4) = uVar8 ^ uVar5;
    lVar9 = lVar9 + 2;
  } while (lVar9 != 0x80);
  lVar9 = 0;
  do {
    P((uint64_t *)((long)local_418 + lVar9),2,(uint64_t *)((long)&local_c18 + lVar9),2);
    lVar9 = lVar9 + 0x80;
  } while (lVar9 != 0x400);
  lVar9 = 0;
  do {
    P((uint64_t *)((long)local_818 + lVar9),0x10,(uint64_t *)((long)local_418 + lVar9),0x10);
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x80);
  lVar9 = 0;
  do {
    *(ulong *)(out + lVar9 * 8) =
         (&local_c18)[lVar9] ^ *(ulong *)(out + lVar9 * 8) ^ local_818[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x80);
  smemclr(&local_c18,0x400);
  smemclr(local_418,0x400);
  smemclr(local_818,0x400);
  return;
}

Assistant:

static void G_xor(uint8_t *out, const uint8_t *X, const uint8_t *Y)
{
    uint64_t R[128], Q[128], Z[128];

    for (unsigned i = 0; i < 128; i++)
        R[i] = GET_64BIT_LSB_FIRST(X + 8*i) ^ GET_64BIT_LSB_FIRST(Y + 8*i);

    for (unsigned i = 0; i < 8; i++)
        P(Q+16*i, 2, R+16*i, 2);

    for (unsigned i = 0; i < 8; i++)
        P(Z+2*i, 16, Q+2*i, 16);

    for (unsigned i = 0; i < 128; i++)
        PUT_64BIT_LSB_FIRST(out + 8*i,
                            GET_64BIT_LSB_FIRST(out + 8*i) ^ R[i] ^ Z[i]);

    smemclr(R, sizeof(R));
    smemclr(Q, sizeof(Q));
    smemclr(Z, sizeof(Z));
}